

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O3

FT_Error T42_Face_Init(FT_Stream stream,FT_Face t42face,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  FT_Memory memory;
  FT_Stream stream_00;
  uchar *puVar5;
  FT_GlyphSlot_conflict pFVar6;
  FT_Library __s2;
  FT_Bitmap_Size *pFVar7;
  FT_Pos FVar8;
  FT_Pos FVar9;
  FT_Pos FVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  FT_Int FVar16;
  undefined8 uVar17;
  FT_Error FVar18;
  int iVar19;
  FT_Pointer pvVar20;
  FT_String *pFVar21;
  FT_String *pFVar22;
  size_t sVar23;
  FT_Byte *buffer;
  char *pcVar24;
  char *pcVar25;
  ulong uVar26;
  FT_Face pFVar27;
  long lVar28;
  FT_Face pFVar29;
  undefined8 *puVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  FT_Open_Args args;
  FT_Error local_2d0;
  FT_Int local_2cc;
  FT_Face local_2c8;
  FT_Pointer local_2c0;
  FT_Face local_2b8;
  FT_Face local_2b0;
  FT_Face local_2a8;
  FT_String *local_2a0;
  FT_Face local_298 [2];
  int local_288;
  FT_Int local_27c;
  FT_Parameter *local_278;
  FT_Open_Args local_270;
  code *local_230;
  code *local_200;
  code *local_1f0;
  code *local_1e8;
  FT_Stream local_1e0;
  undefined1 local_1d8 [16];
  char local_1c8;
  FT_Int local_1c0;
  undefined1 local_1b8 [32];
  int local_198;
  long local_190;
  code *local_160;
  uint local_158;
  FT_Pos local_150 [5];
  FT_GlyphSlot_conflict local_128;
  code *local_f8;
  FT_Generic_Finalizer local_f0 [3];
  long local_d8;
  FT_Size local_c8;
  FT_CharMap pFStack_c0;
  code *local_98;
  undefined1 local_90 [88];
  code *local_38;
  
  t42face[3].available_sizes = (FT_Bitmap_Size *)0x0;
  t42face->num_faces = 1;
  pvVar20 = ft_module_get_service(&t42face->driver->root,"postscript-cmaps",'\x01');
  t42face[3].num_glyphs = (FT_Long)pvVar20;
  pFVar21 = (FT_String *)FT_Get_Module_Interface((t42face->driver->root).library,"psaux");
  t42face[3].family_name = pFVar21;
  if (pFVar21 == (FT_String *)0x0) {
    return 0xb;
  }
  memory = t42face->memory;
  local_27c = face_index;
  local_278 = params;
  memset(&local_270,0,0x240);
  pFVar22 = (FT_String *)ft_mem_alloc(memory,0xc,&local_2d0);
  t42face[3].style_name = pFVar22;
  FVar18 = local_2d0;
  if (local_2d0 == 0) {
    *(undefined8 *)&t42face[3].num_fixed_sizes = 0xc;
    stream_00 = t42face->stream;
    local_2cc = num_params;
    (*(code *)**(undefined8 **)(pFVar21 + 8))(&local_270,0,0);
    local_1d8 = (undefined1  [16])0x0;
    local_1c8 = '\0';
    local_1e0 = stream_00;
    FVar18 = FT_Stream_Seek(stream_00,0);
    local_298[0] = (FT_Face)CONCAT44(local_298[0]._4_4_,FVar18);
    num_params = local_2cc;
    if (FVar18 == 0) {
      FVar18 = FT_Stream_EnterFrame(stream_00,0x11);
      num_params = local_2cc;
      local_298[0] = (FT_Face)CONCAT44(local_298[0]._4_4_,FVar18);
      if (FVar18 != 0) goto LAB_00179810;
      puVar5 = stream_00->cursor;
      auVar31[0] = -(*puVar5 == '%');
      auVar31[1] = -(puVar5[1] == '!');
      auVar31[2] = -(puVar5[2] == 'P');
      auVar31[3] = -(puVar5[3] == 'S');
      auVar31[4] = -(puVar5[4] == '-');
      auVar31[5] = -(puVar5[5] == 'T');
      auVar31[6] = -(puVar5[6] == 'r');
      auVar31[7] = -(puVar5[7] == 'u');
      auVar31[8] = -(puVar5[8] == 'e');
      auVar31[9] = -(puVar5[9] == 'T');
      auVar31[10] = -(puVar5[10] == 'y');
      auVar31[0xb] = -(puVar5[0xb] == 'p');
      auVar31[0xc] = -(puVar5[0xc] == 'e');
      auVar31[0xd] = -(puVar5[0xd] == 'F');
      auVar31[0xe] = -(puVar5[0xe] == 'o');
      auVar31[0xf] = -(puVar5[0xf] == 'n');
      auVar32[0] = -(puVar5[0x10] == 't');
      auVar32[1] = 0xff;
      auVar32[2] = 0xff;
      auVar32[3] = 0xff;
      auVar32[4] = 0xff;
      auVar32[5] = 0xff;
      auVar32[6] = 0xff;
      auVar32[7] = 0xff;
      auVar32[8] = 0xff;
      auVar32[9] = 0xff;
      auVar32[10] = 0xff;
      auVar32[0xb] = 0xff;
      auVar32[0xc] = 0xff;
      auVar32[0xd] = 0xff;
      auVar32[0xe] = 0xff;
      auVar32[0xf] = 0xff;
      auVar32 = auVar32 & auVar31;
      if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff) {
        local_298[0] = (FT_Face)CONCAT44(local_298[0]._4_4_,2);
        FT_Stream_ExitFrame(stream_00);
        FVar18 = 2;
        goto LAB_00179810;
      }
      FT_Stream_ExitFrame(stream_00);
      FVar18 = FT_Stream_Seek(stream_00,0);
      local_298[0] = (FT_Face)CONCAT44(local_298[0]._4_4_,FVar18);
      if (FVar18 != 0) goto LAB_00179810;
      pFVar27 = (FT_Face)stream_00->size;
      if (stream_00->read != (FT_Stream_IoFunc)0x0) {
        local_2c8 = pFVar27;
        buffer = (FT_Byte *)ft_mem_alloc(memory,(FT_Long)pFVar27,(FT_Error *)local_298);
        num_params = local_2cc;
        local_1d8._0_8_ = buffer;
        FVar18 = (int)local_298[0];
        if ((int)local_298[0] == 0) {
          FVar18 = FT_Stream_Read(stream_00,buffer,(FT_ULong)local_2c8);
          local_298[0] = (FT_Face)CONCAT44(local_298[0]._4_4_,FVar18);
          if (FVar18 == 0) {
            local_1d8._8_8_ = local_2c8;
            pFVar27 = local_2c8;
            goto LAB_0017a15d;
          }
        }
        goto LAB_00179810;
      }
      local_1d8._8_8_ = pFVar27;
      local_1d8._0_8_ = stream_00->base + stream_00->pos;
      local_1c8 = '\x01';
      FVar18 = FT_Stream_Skip(stream_00,(FT_Long)pFVar27);
      local_298[0] = (FT_Face)CONCAT44(local_298[0]._4_4_,FVar18);
      if (FVar18 != 0) goto LAB_00179810;
      pFVar27 = (FT_Face)local_1d8._8_8_;
LAB_0017a15d:
      local_270.memory_base = (FT_Byte *)local_1d8._0_8_;
      local_2d0 = 0;
      local_270._0_8_ = local_1d8._0_8_;
LAB_0017985e:
      pFVar27 = (FT_Face)((long)&pFVar27->num_faces + (long)&((FT_Face)local_270._0_8_)->num_faces);
      local_270.pathname._0_4_ = 0;
      local_2c0 = pvVar20;
      local_270.memory_size = (FT_Long)pFVar27;
      (*(code *)local_270.params)(&local_270);
      pvVar20 = local_2c0;
      local_2c8 = pFVar27;
      local_2a0 = pFVar21;
      if ((ulong)local_270._0_8_ < pFVar27) {
        local_2b0 = (FT_Face)&t42face[2].extensions;
        local_2b8 = (FT_Face)&t42face[1].num_fixed_sizes;
        local_2a8 = t42face + 1;
        do {
          pFVar27 = local_2c8;
          if ((*(char *)local_270._0_8_ == 'F') &&
             ((char *)(local_270._0_8_ + 0x18 + 1) < local_2c8)) {
            iVar19 = strncmp((char *)local_270._0_8_,"FontDirectory",0xd);
            if (iVar19 == 0) {
              (*local_230)(&local_270);
              (*(code *)local_270.params)(&local_270);
              uVar17 = local_270._0_8_;
              if ((ulong)local_270._0_8_ < pFVar27) {
                do {
                  if (((*(char *)local_270._0_8_ == 'k') &&
                      ((char *)(local_270._0_8_ + 5) < pFVar27)) &&
                     (iVar19 = strncmp((char *)local_270._0_8_,"known",5), iVar19 == 0)) {
                    (*local_230)(&local_270);
                    (*local_200)(&local_270,local_298);
                    if (local_288 == 3) {
                      uVar17 = local_270._0_8_;
                    }
                    break;
                  }
                  (*local_230)(&local_270);
                  pFVar21 = local_2a0;
                  num_params = local_2cc;
                  FVar18 = (int)local_270.pathname;
                  if ((int)local_270.pathname != 0) goto LAB_00179db8;
                  (*(code *)local_270.params)(&local_270);
                  pFVar27 = local_2c8;
                } while ((ulong)local_270._0_8_ < local_2c8);
              }
            }
            else {
LAB_00179a2b:
              (*local_230)(&local_270);
LAB_00179a3e:
              pFVar21 = local_2a0;
              num_params = local_2cc;
              FVar18 = (int)local_270.pathname;
              uVar17 = local_270._0_8_;
              if ((int)local_270.pathname != 0) goto LAB_00179db8;
            }
          }
          else {
            if ((*(char *)local_270._0_8_ != '/') || (local_2c8 <= (char *)(local_270._0_8_ + 2)))
            goto LAB_00179a2b;
            pcVar24 = (char *)(local_270._0_8_ + 1);
            local_270._0_8_ = pcVar24;
            (*local_230)(&local_270);
            pFVar21 = local_2a0;
            num_params = local_2cc;
            FVar18 = (int)local_270.pathname;
            if ((int)local_270.pathname != 0) goto LAB_00179db8;
            uVar17 = local_270._0_8_;
            if (((int)(local_270._0_8_ - (long)pcVar24) - 1U < 0x15) &&
               ((ulong)local_270._0_8_ < local_2c8)) {
              uVar26 = local_270._0_8_ - (long)pcVar24 & 0xffffffff;
              lVar28 = 0;
              do {
                pcVar25 = *(char **)((long)&t42_keywords[0].ident + lVar28);
                if ((((pcVar25 != (char *)0x0) && (*pcVar24 == *pcVar25)) &&
                    (sVar23 = strlen(pcVar25), uVar26 == sVar23)) &&
                   (iVar19 = bcmp(pcVar24,pcVar25,uVar26), iVar19 == 0)) {
                  iVar19 = *(int *)((long)&t42_keywords[0].type + lVar28);
                  if (iVar19 == 0xb) {
                    (**(code **)((long)&t42_keywords[0].reader + lVar28))(t42face,&local_270);
                  }
                  else {
                    iVar3 = *(int *)((long)&t42_keywords[0].location + lVar28);
                    local_298[0] = local_2b8;
                    if ((iVar3 != 2) && (local_298[0] = local_2b0, iVar3 != 5)) {
                      local_298[0] = local_2a8;
                    }
                    if (iVar19 - 9U < 2) {
                      local_270.pathname._0_4_ = (*local_1e8)();
                    }
                    else {
                      local_270.pathname._0_4_ =
                           (*local_1f0)(&local_270,(long)&t42_keywords[0].ident + lVar28,local_298,0
                                        ,0);
                    }
                  }
                  goto LAB_00179a3e;
                }
                lVar28 = lVar28 + 0x30;
                uVar17 = local_270._0_8_;
              } while (lVar28 != 0x3c0);
            }
          }
          local_270._0_8_ = uVar17;
          (*(code *)local_270.params)(&local_270);
          num_params = local_2cc;
        } while ((ulong)local_270._0_8_ < local_2c8);
      }
      local_2d0 = (int)local_270.pathname;
      pFVar21 = local_2a0;
      FVar18 = local_2d0;
      if ((int)local_270.pathname == 0) {
        if (*(char *)((long)&t42face[2].driver + 1) == '*') {
          local_2c8 = (FT_Face)(ulong)local_158;
          t42face[2].max_advance_width = (undefined2)local_158;
          t42face[2].max_advance_height = local_158._2_2_;
          if (local_d8 == 0) {
            local_2d0 = 3;
          }
          local_d8 = 0;
          t42face[2].generic.finalizer = local_f0[0];
          t42face[2].size = local_c8;
          t42face[2].charmap = pFStack_c0;
          t42face[2].bbox.xMin = local_150[0];
          t42face[2].glyph = local_128;
          local_150[0] = 0;
          local_128 = (FT_GlyphSlot_conflict)0x0;
          FVar18 = local_2d0;
          if (*(int *)&t42face[2].style_name == 1) {
            local_2b0 = (FT_Face)0x0;
            pFVar27 = (FT_Face)(long)local_198;
            local_2b8 = (FT_Face)0x0;
            if (0 < (long)pFVar27) {
              pFVar29 = (FT_Face)0x0;
              local_2b8 = (FT_Face)0x0;
              local_2b0 = (FT_Face)0x0;
              local_2c0 = pvVar20;
              local_2a8 = pFVar27;
              do {
                *(undefined2 *)(*(long *)&t42face[2].num_charmaps + (long)pFVar29 * 2) = 0;
                t42face[2].charmaps[(long)pFVar29] = (FT_CharMap)".notdef";
                pcVar24 = *(char **)(local_190 + (long)pFVar29 * 8);
                if (pcVar24 != (char *)0x0 && 0 < (int)local_2c8) {
                  pFVar6 = t42face[2].glyph;
                  lVar28 = 0;
                  do {
                    __s2 = (&pFVar6->library)[lVar28];
                    iVar19 = strcmp(pcVar24,(char *)__s2);
                    if (iVar19 == 0) {
                      *(short *)(*(long *)&t42face[2].num_charmaps + (long)pFVar29 * 2) =
                           (short)lVar28;
                      t42face[2].charmaps[(long)pFVar29] = (FT_CharMap)__s2;
                      iVar19 = strcmp(".notdef",(char *)__s2);
                      pFVar27 = local_2a8;
                      pFVar21 = local_2a0;
                      pvVar20 = local_2c0;
                      if (iVar19 != 0) {
                        if ((int)pFVar29 < (int)local_2b0) {
                          local_2b0 = pFVar29;
                        }
                        local_2b0 = (FT_Face)((ulong)local_2b0 & 0xffffffff);
                        iVar19 = (int)local_2b8;
                        local_2b8 = (FT_Face)((ulong)local_2b8 & 0xffffffff);
                        if ((long)iVar19 <= (long)pFVar29) {
                          local_2b8 = (FT_Face)(ulong)((int)pFVar29 + 1);
                        }
                      }
                      break;
                    }
                    lVar28 = lVar28 + 1;
                    pFVar27 = local_2a8;
                    pFVar21 = local_2a0;
                    pvVar20 = local_2c0;
                  } while (local_2c8 != (FT_Face)lVar28);
                }
                pFVar29 = (FT_Face)((long)&pFVar29->num_faces + 1);
              } while (pFVar29 != pFVar27);
            }
            *(int *)&t42face[2].field_0x3c = (int)local_2b0;
            *(int *)&t42face[2].available_sizes = (int)local_2b8;
            t42face[2].num_fixed_sizes = local_1c0;
            num_params = local_2cc;
            FVar18 = local_2d0;
          }
        }
        else {
          local_2d0 = 2;
          FVar18 = local_2d0;
        }
      }
    }
    else {
LAB_00179810:
      if (local_1c8 == '\0') {
        ft_mem_free(memory,(void *)local_1d8._0_8_);
        pFVar27 = (FT_Face)local_1d8._8_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_1d8._8_8_;
        local_1d8 = auVar11 << 0x40;
        local_2d0 = (int)local_298[0];
        FVar18 = local_2d0;
        if ((int)local_298[0] == 0) {
          local_270._0_8_ = (FT_Face)0x0;
          goto LAB_0017985e;
        }
      }
    }
  }
LAB_00179db8:
  local_2d0 = FVar18;
  if (local_160 != (code *)0x0) {
    (*local_160)(local_1b8);
  }
  FVar16 = local_27c;
  if (local_98 != (code *)0x0) {
    (*local_98)(local_f0);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(local_150);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(local_90);
  }
  if (local_1c8 == '\0') {
    ft_mem_free((FT_Memory)local_270.stream,(void *)local_1d8._0_8_);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_1d8._8_8_;
    local_1d8 = auVar12 << 0x40;
  }
  (*(code *)CONCAT44(local_270._52_4_,local_270.num_params))();
  if (FVar16 < 0 || local_2d0 != 0) {
    return local_2d0;
  }
  if ((short)FVar16 != 0) {
    return 6;
  }
  iVar19._0_2_ = t42face[2].max_advance_width;
  iVar19._2_2_ = t42face[2].max_advance_height;
  t42face->num_glyphs = (long)iVar19;
  t42face->num_charmaps = 0;
  t42face->face_index = 0;
  t42face->face_flags =
       (ulong)(*(char *)&t42face[1].style_name != '\0') << 2 | t42face->face_flags | 0xa11;
  pcVar24 = (char *)t42face[1].style_flags;
  t42face->family_name = pcVar24;
  t42face->style_name = "Regular";
  if (pcVar24 == (char *)0x0) {
    if (t42face[2].family_name != (FT_String *)0x0) {
      t42face->family_name = t42face[2].family_name;
    }
  }
  else {
    pcVar25 = (char *)t42face[1].face_flags;
    if (pcVar25 != (char *)0x0) {
      while (cVar1 = *pcVar25, cVar1 != '\0') {
        cVar2 = *pcVar24;
        if (cVar1 == cVar2) {
          pcVar24 = pcVar24 + 1;
LAB_00179eed:
          pcVar25 = pcVar25 + 1;
        }
        else {
          if ((cVar1 == '-') || (cVar1 == ' ')) goto LAB_00179eed;
          if ((cVar2 != ' ') && (cVar2 != '-')) {
            if (cVar2 == '\0') {
              t42face->style_name = pcVar25;
            }
            break;
          }
          pcVar24 = pcVar24 + 1;
        }
      }
    }
  }
  t42face->num_fixed_sizes = 0;
  t42face->available_sizes = (FT_Bitmap_Size *)0x0;
  local_270.flags = 9;
  local_270.driver = FT_Get_Module((t42face->driver->root).library,"truetype");
  local_270.memory_base = (FT_Byte *)t42face[3].style_name;
  local_270.memory_size = *(FT_Long *)&t42face[3].num_fixed_sizes;
  if (num_params != 0) {
    local_270.flags = 0x19;
    local_270.params = local_278;
    local_270.num_params = num_params;
  }
  FVar18 = FT_Open_Face((t42face->driver->root).library,&local_270,0,
                        (FT_Face_conflict *)&t42face[3].available_sizes);
  if (FVar18 != 0) {
    return FVar18;
  }
  FT_Done_Size(*(FT_Size *)(t42face[3].available_sizes + 5));
  pFVar7 = t42face[3].available_sizes;
  FVar8 = pFVar7[3].x_ppem;
  FVar9 = pFVar7[3].y_ppem;
  FVar10 = *(FT_Pos *)(pFVar7 + 4);
  (t42face->bbox).xMin = pFVar7[3].size;
  (t42face->bbox).yMin = FVar8;
  (t42face->bbox).xMax = FVar9;
  (t42face->bbox).yMax = FVar10;
  uVar13 = *(undefined2 *)((long)&pFVar7[4].size + 2);
  uVar14 = *(undefined2 *)((long)&pFVar7[4].size + 4);
  uVar15 = *(undefined2 *)((long)&pFVar7[4].size + 6);
  t42face->units_per_EM = *(undefined2 *)&pFVar7[4].size;
  t42face->ascender = uVar13;
  t42face->descender = uVar14;
  t42face->height = uVar15;
  uVar4 = (undefined4)pFVar7[4].x_ppem;
  t42face->max_advance_width = (short)uVar4;
  t42face->max_advance_height = (short)((uint)uVar4 >> 0x10);
  uVar4 = *(undefined4 *)((long)&t42face[1].style_name + 2);
  t42face->underline_position = (short)uVar4;
  t42face->underline_thickness = (short)((uint)uVar4 >> 0x10);
  uVar26 = (ulong)(t42face[1].family_name != (FT_String *)0x0);
  t42face->style_flags = uVar26;
  if ((pFVar7->y_ppem & 2) != 0) {
    t42face->style_flags = uVar26 | 2;
  }
  if ((pFVar7->x_ppem & 0x20) != 0) {
    *(byte *)&t42face->face_flags = (byte)t42face->face_flags | 0x20;
  }
  if (pvVar20 == (FT_Pointer)0x0) {
switchD_0017a08b_default:
    FVar18 = 0;
  }
  else {
    puVar30 = *(undefined8 **)(pFVar21 + 0x40);
    local_270.memory_base = (FT_Byte *)0x10003756e6963;
    local_270._0_8_ = t42face;
    FVar18 = FT_CMap_New((FT_CMap_Class)puVar30[3],(FT_Pointer)0x0,(FT_CharMap)&local_270,
                         (FT_CMap_conflict *)0x0);
    if (FVar18 != 0 && (char)FVar18 != -0x5d) {
      return FVar18;
    }
    switch(*(undefined4 *)&t42face[2].style_name) {
    case 1:
      local_270.memory_base = (FT_Byte *)0x2000741444243;
      puVar30 = puVar30 + 2;
      break;
    case 2:
      local_270.memory_base = (FT_Byte *)0x741444f42;
      break;
    case 3:
      puVar30 = puVar30 + 3;
      local_270.memory_base = (FT_Byte *)0x300076c617431;
      break;
    case 4:
      local_270.memory_base = (FT_Byte *)0x1000741444245;
      puVar30 = puVar30 + 1;
      break;
    default:
      goto switchD_0017a08b_default;
    }
    FVar18 = 0;
    if ((FT_CMap_Class)*puVar30 != (FT_CMap_Class)0x0) {
      FVar18 = FT_CMap_New((FT_CMap_Class)*puVar30,(FT_Pointer)0x0,(FT_CharMap)&local_270,
                           (FT_CMap_conflict *)0x0);
    }
  }
  return FVar18;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Face_Init( FT_Stream      stream,
                 FT_Face        t42face,       /* T42_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    T42_Face            face  = (T42_Face)t42face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    FT_Face             root  = (FT_Face)&face->root;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info  = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->ttf_face       = NULL;
    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T42_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    FT_TRACE2(( "Type 42 driver\n" ));

    /* open the tokenizer, this will also check the font format */
    error = T42_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T42_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Now load the font program into the face object */

    /* Init the face object fields */
    /* Now set up root face fields */

    root->num_glyphs   = type1->num_glyphs;
    root->num_charmaps = 0;
    root->face_index   = 0;

    root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                        FT_FACE_FLAG_HORIZONTAL  |
                        FT_FACE_FLAG_GLYPH_NAMES;

    if ( info->is_fixed_pitch )
      root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

#ifdef TT_CONFIG_OPTION_BYTECODE_INTERPRETER
    root->face_flags |= FT_FACE_FLAG_HINTER;
#endif

    /* XXX: TODO -- add kerning with .afm support */

    /* get style name -- be careful, some broken fonts only */
    /* have a `/FontName' dictionary entry!                 */
    root->family_name = info->family_name;
    /* assume "Regular" style if we don't know better */
    root->style_name = (char *)"Regular";
    if ( root->family_name )
    {
      char*  full   = info->full_name;
      char*  family = root->family_name;


      if ( full )
      {
        while ( *full )
        {
          if ( *full == *family )
          {
            family++;
            full++;
          }
          else
          {
            if ( *full == ' ' || *full == '-' )
              full++;
            else if ( *family == ' ' || *family == '-' )
              family++;
            else
            {
              if ( !*family )
                root->style_name = full;
              break;
            }
          }
        }
      }
    }
    else
    {
      /* do we have a `/FontName'? */
      if ( type1->font_name )
        root->family_name = type1->font_name;
    }

    /* no embedded bitmap support */
    root->num_fixed_sizes = 0;
    root->available_sizes = NULL;

    /* Load the TTF font embedded in the T42 font */
    {
      FT_Open_Args  args;


      args.flags       = FT_OPEN_MEMORY | FT_OPEN_DRIVER;
      args.driver      = FT_Get_Module( FT_FACE_LIBRARY( face ),
                                        "truetype" );
      args.memory_base = face->ttf_data;
      args.memory_size = face->ttf_size;

      if ( num_params )
      {
        args.flags     |= FT_OPEN_PARAMS;
        args.num_params = num_params;
        args.params     = params;
      }

      error = FT_Open_Face( FT_FACE_LIBRARY( face ),
                            &args, 0, &face->ttf_face );
    }

    if ( error )
      goto Exit;

    FT_Done_Size( face->ttf_face->size );

    /* Ignore info in FontInfo dictionary and use the info from the  */
    /* loaded TTF font.  The PostScript interpreter also ignores it. */
    root->bbox         = face->ttf_face->bbox;
    root->units_per_EM = face->ttf_face->units_per_EM;

    root->ascender  = face->ttf_face->ascender;
    root->descender = face->ttf_face->descender;
    root->height    = face->ttf_face->height;

    root->max_advance_width  = face->ttf_face->max_advance_width;
    root->max_advance_height = face->ttf_face->max_advance_height;

    root->underline_position  = (FT_Short)info->underline_position;
    root->underline_thickness = (FT_Short)info->underline_thickness;

    /* compute style flags */
    root->style_flags = 0;
    if ( info->italic_angle )
      root->style_flags |= FT_STYLE_FLAG_ITALIC;

    if ( face->ttf_face->style_flags & FT_STYLE_FLAG_BOLD )
      root->style_flags |= FT_STYLE_FLAG_BOLD;

    if ( face->ttf_face->face_flags & FT_FACE_FLAG_VERTICAL )
      root->face_flags |= FT_FACE_FLAG_VERTICAL;

    {
      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }
  Exit:
    return error;
  }